

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<short>::test_many<(libdivide::Branching)0>(DivideTest<short> *this,short denom)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  ushort in_SI;
  undefined8 in_RDI;
  short recovered;
  divider<short,_(libdivide::Branching)0> the_divider;
  int16_t magic;
  uint16_t twice_rem;
  uint16_t e;
  uint16_t proposed_m;
  uint16_t rem;
  uint8_t more;
  uint16_t floor_log_2_d;
  uint16_t absD;
  uint16_t ud;
  libdivide_s16_t result;
  uint16_t result_1;
  uint32_t n;
  divider<short,_(libdivide::Branching)0> *in_stack_ffffffffffffff30;
  ostream *poVar4;
  undefined8 in_stack_ffffffffffffff38;
  string *psVar5;
  short denom_00;
  undefined4 in_stack_ffffffffffffff40;
  short denom_01;
  DivideTest<short> *this_00;
  undefined6 in_stack_ffffffffffffff58;
  short in_stack_ffffffffffffff5e;
  DivideTest<short> *in_stack_ffffffffffffff60;
  string local_98 [32];
  ushort local_78;
  DivideTest<short> local_75 [2];
  DivideTest<short> *local_60;
  DivideTest<short> *local_50;
  short local_48;
  byte local_46;
  short local_3f;
  byte local_3d;
  short local_3c;
  byte local_3a;
  short local_36;
  ushort local_34;
  ushort local_32;
  short in_stack_ffffffffffffffd0;
  ushort in_stack_ffffffffffffffd2;
  undefined1 in_stack_ffffffffffffffd4;
  byte in_stack_ffffffffffffffd5;
  short denom_02;
  undefined2 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe4;
  short sVar6;
  byte bVar7;
  uint local_4;
  
  denom_01 = (short)((ulong)in_RDI >> 0x30);
  denom_00 = (short)((ulong)in_stack_ffffffffffffff38 >> 0x30);
  this_00 = local_75;
  local_60 = this_00;
  local_50 = this_00;
  if (in_SI == 0) {
    fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x4fb,"libdivide_internal_s16_gen",
            "divider must be != 0");
    abort();
  }
  if ((short)in_SI < 0) {
    uVar3 = -(uint)in_SI;
  }
  else {
    uVar3 = (uint)in_SI;
  }
  uVar1 = (ushort)uVar3;
  sVar2 = 0xf - ((short)LZCOUNT(uVar3 & 0xffff) + -0x10);
  local_46 = (byte)sVar2;
  if ((uVar3 & 0xffff & (uVar3 & 0xffff) - 1) == 0) {
    local_48 = 0;
    bVar7 = 0;
    if ((short)in_SI < 0) {
      bVar7 = 0x80;
    }
    local_46 = local_46 | bVar7;
  }
  else {
    local_4 = (1 << (local_46 - 1 & 0x1f)) << 0x10;
    in_stack_ffffffffffffffd0 = (short)(local_4 / (uVar3 & 0xffff));
    sVar6 = in_stack_ffffffffffffffd0 * uVar1;
    in_stack_ffffffffffffffd2 = -sVar6;
    local_32 = uVar1 + sVar6;
    if ((int)(uint)local_32 < 1 << (local_46 & 0x1f)) {
      in_stack_ffffffffffffffd5 = local_46 - 1;
    }
    else {
      in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 * 2;
      local_34 = sVar6 * -2;
      if ((uVar1 <= local_34) || (local_34 < in_stack_ffffffffffffffd2)) {
        in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + 1;
      }
      in_stack_ffffffffffffffd5 = local_46 | 0x40;
    }
    in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + 1;
    local_36 = in_stack_ffffffffffffffd0;
    local_48 = in_stack_ffffffffffffffd0;
    local_46 = in_stack_ffffffffffffffd5;
    if ((short)in_SI < 0) {
      in_stack_ffffffffffffffd5 = in_stack_ffffffffffffffd5 | 0x80;
      local_36 = -in_stack_ffffffffffffffd0;
      local_48 = local_36;
      local_46 = in_stack_ffffffffffffffd5;
    }
  }
  denom_02 = 0;
  local_75[0]._3_2_ = in_SI;
  local_3f = local_48;
  local_3d = local_46;
  local_3c = local_48;
  local_3a = local_46;
  sVar6 = local_48;
  bVar7 = local_46;
  local_75[0].seed._0_2_ = local_48;
  local_75[0].seed._2_1_ = local_46;
  local_78 = libdivide::divider<short,_(libdivide::Branching)0>::recover
                       ((divider<short,_(libdivide::Branching)0> *)local_75);
  if (local_78 != local_75[0]._3_2_) {
    poVar4 = (ostream *)&std::cerr;
    std::operator<<((ostream *)&std::cerr,"Failed to recover divisor for ");
    psVar5 = local_98;
    testcase_name_abi_cxx11_
              ((DivideTest<short> *)CONCAT26(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58),
               (int)((ulong)this_00 >> 0x20));
    std::operator<<(poVar4,psVar5);
    std::__cxx11::string::~string(local_98);
    std::operator<<((ostream *)&std::cerr,": ");
    std::ostream::operator<<((ostream *)&std::cerr,local_75[0]._3_2_);
    std::operator<<((ostream *)&std::cerr,", but got ");
    std::ostream::operator<<((ostream *)&std::cerr,local_78);
    std::operator<<((ostream *)&std::cerr,"\n");
    exit(1);
  }
  test_edgecase_numerators<(libdivide::Branching)0>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5e,
             (divider<short,_(libdivide::Branching)0> *)this_00);
  test_small_numerators<(libdivide::Branching)0>
            ((DivideTest<short> *)CONCAT44(uVar3,in_stack_ffffffffffffff40),denom_00,
             in_stack_ffffffffffffff30);
  test_pow2_numerators<(libdivide::Branching)0>
            (this_00,denom_01,
             (divider<short,_(libdivide::Branching)0> *)CONCAT44(uVar3,in_stack_ffffffffffffff40));
  test_allbits_numerators<(libdivide::Branching)0>
            ((DivideTest<short> *)CONCAT44(uVar3,in_stack_ffffffffffffff40),denom_00,
             in_stack_ffffffffffffff30);
  test_random_numerators<(libdivide::Branching)0>
            (this_00,denom_01,
             (divider<short,_(libdivide::Branching)0> *)CONCAT44(uVar3,in_stack_ffffffffffffff40));
  test_vectordivide_numerators<(libdivide::Branching)0>
            ((DivideTest<short> *)
             CONCAT17(bVar7,CONCAT25(sVar6,CONCAT14(in_stack_ffffffffffffffe4,
                                                    CONCAT22(in_SI,in_stack_ffffffffffffffe0)))),
             denom_02,(divider<short,_(libdivide::Branching)0> *)
                      CONCAT26(sVar2,CONCAT15(in_stack_ffffffffffffffd5,
                                              CONCAT14(in_stack_ffffffffffffffd4,
                                                       CONCAT22(in_stack_ffffffffffffffd2,
                                                                in_stack_ffffffffffffffd0)))));
  return;
}

Assistant:

void test_many(T denom) {
        // Don't try dividing by 1 with unsigned branchfree
        if (ALGO == BRANCHFREE && !std::numeric_limits<T>::is_signed && denom == 1) {
            return;
        }

        const divider<T, ALGO> the_divider = divider<T, ALGO>(denom);
        T recovered = the_divider.recover();
        if (recovered != denom) {
            PRINT_ERROR(F("Failed to recover divisor for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(recovered);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }

        test_edgecase_numerators(denom, the_divider);
        test_small_numerators(denom, the_divider);
        test_pow2_numerators(denom, the_divider);
        test_allbits_numerators(denom, the_divider);
#if !defined(__AVR__)
        test_random_numerators(denom, the_divider);
        test_vectordivide_numerators(denom, the_divider);
#endif
    }